

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayIndexStaticEnumerator.h
# Opt level: O0

void __thiscall
Js::ES5ArrayIndexStaticEnumerator<false>::Reset(ES5ArrayIndexStaticEnumerator<false> *this)

{
  uint32 uVar1;
  ES5ArrayIndexStaticEnumerator<false> *this_local;
  
  uVar1 = ArrayObject::GetLength((ArrayObject *)this->m_array);
  this->m_initialLength = uVar1;
  this->m_index = 0xffffffff;
  this->m_dataIndex = 0xffffffff;
  this->m_descriptorIndex = 0xffffffff;
  this->m_descriptor = (IndexPropertyDescriptor *)0x0;
  this->m_descriptorValidationToken = (void *)0x0;
  return;
}

Assistant:

void Reset()
        {
            m_initialLength = m_array->GetLength();
            m_index = JavascriptArray::InvalidIndex;
            m_dataIndex = JavascriptArray::InvalidIndex;
            m_descriptorIndex = JavascriptArray::InvalidIndex;
            m_descriptor = NULL;
            m_descriptorValidationToken = nullptr;
        }